

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O1

string_t * __thiscall
cfgfile::
tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
::print(string_t *__return_storage_ptr__,
       tag_vector_of_tags_t<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_cfgfile::string_trait_t>
       *this,int indent)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  pointer psVar4;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar3 = tag_t<cfgfile::string_trait_t>::is_defined(&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar3) {
    psVar4 = (this->m_tags).
             super__Vector_base<std::shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->m_tags).
             super__Vector_base<std::shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar4 != psVar1) {
      do {
        peVar2 = (psVar4->
                 super___shared_ptr<cfgfile::tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        (*(peVar2->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[3])
                  (local_50,peVar2,(ulong)(uint)indent);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        psVar4 = psVar4 + 1;
      } while (psVar4 != psVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			for( const ptr_to_tag_t & p : m_tags )
				result.append( p->print( indent ) );
		}

		return result;
	}